

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall Descriptor_Parse_addr_Test::TestBody(Descriptor_Parse_addr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_468;
  Message local_460;
  string local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_1;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  Message local_400;
  string local_3f8;
  AssertHelper local_3d8;
  Message local_3d0;
  Script local_3c8;
  AssertHelper local_390;
  Message local_388 [2];
  Descriptor local_378;
  allocator local_209;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_addr_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"",&local_209);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_378,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_378);
      cfd::core::Descriptor::~Descriptor(&local_378);
    }
  }
  else {
    testing::Message::Message(local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x182,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(local_388);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_3c8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_3c8);
      cfd::core::Script::~Script(&local_3c8);
    }
  }
  else {
    testing::Message::Message(&local_3d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x183,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message(&local_3d0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_3f8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
    }
  }
  else {
    testing::Message::Message(&local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x184,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_400);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_418,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  cfd::core::Script::ToString_abi_cxx11_(&local_458,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_438,"locking_script.ToString().c_str()",
             "\"0 c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d\"",pcVar2,
             "0 c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d");
  std::__cxx11::string::~string((string *)&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_addr) {
  std::string descriptor = "addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "0 c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d");
}